

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

ObjectPtr __thiscall ICM::DefFunc::Calc::Add<17UL>::func(Add<17UL> *this,DataList *list)

{
  bool bVar1;
  int iVar2;
  Object **ppOVar3;
  undefined4 extraout_var;
  unsigned_long id;
  Ty<17UL> *dl;
  Ty<17UL> *this_00;
  int in_ECX;
  lightlist<ICM::Object_*> *in_RDX;
  void *__child_stack;
  void *in_R8;
  unsigned_long i;
  RIterator<unsigned_long> __end3;
  RIterator<unsigned_long> __begin3;
  unsigned_long local_48;
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> local_40;
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *local_30;
  Range<unsigned_long> *__range3;
  Object *tmp;
  DataList *list_local;
  Add<17UL> *this_local;
  
  tmp = (Object *)in_RDX;
  list_local = list;
  this_local = this;
  ppOVar3 = Common::lightlist<ICM::Object_*>::front(in_RDX);
  iVar2 = Object::clone(*ppOVar3,(__fn *)list,__child_stack,in_ECX,in_R8);
  __range3 = (Range<unsigned_long> *)CONCAT44(extraout_var,iVar2);
  local_48 = 1;
  __begin3.value = Common::lightlist<ICM::Object_*>::size((lightlist<ICM::Object_*> *)tmp);
  Common::Range<unsigned_long>::Range((Range<unsigned_long> *)&local_40,&local_48,&__begin3.value);
  local_30 = &local_40;
  __end3 = Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::begin(local_30);
  i = (unsigned_long)
      Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::end(local_30);
  while( true ) {
    bVar1 = Common::RIterator<unsigned_long>::operator!=(&__end3,(RIterator<unsigned_long> *)&i);
    if (!bVar1) break;
    id = Common::RIterator<unsigned_long>::operator*(&__end3);
    ppOVar3 = Common::lightlist<ICM::Object_*>::operator[]((lightlist<ICM::Object_*> *)tmp,id);
    dl = Object::dat<17ul>(*ppOVar3);
    this_00 = Object::dat<17ul>((Object *)__range3);
    TypeBase::ListType::operator+=(this_00,dl);
    Common::RIterator<unsigned_long>::operator++(&__end3);
  }
  ObjectPtr::ObjectPtr((ObjectPtr *)this,(Object *)__range3);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					Object *tmp = list.front()->clone();
					for (auto i : Range<size_t>(1, list.size()))
						tmp->dat<_TU>() += list[i]->dat<_TU>();
					return ObjectPtr(tmp);
				}